

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_linearize.h
# Opt level: O0

ClusterIndex __thiscall
cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::AddTransaction
          (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *this,FeeFrac *feefrac)

{
  long lVar1;
  ClusterIndex CVar2;
  size_type sVar3;
  vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  *in_RSI;
  IntBitSet<unsigned_int> *in_RDI;
  long in_FS_OFFSET;
  ClusterIndex new_idx;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  bool *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  *this_00;
  int line;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = TxCount(in_stack_ffffffffffffffa8);
  line = (int)(sVar3 >> 0x20);
  bitset_detail::IntBitSet<unsigned_int>::Size();
  inline_assertion_check<false,bool>
            (in_stack_ffffffffffffffc8,(char *)in_RDI,line,
             (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (char *)in_stack_ffffffffffffffa8);
  sVar3 = TxCount(in_stack_ffffffffffffffa8);
  CVar2 = (ClusterIndex)sVar3;
  this_00 = in_RSI;
  bitset_detail::IntBitSet<unsigned_int>::Singleton(0);
  bitset_detail::IntBitSet<unsigned_int>::Singleton(0);
  std::
  vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>::Entry,std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>::Entry>>
  ::
  emplace_back<FeeFrac_const&,bitset_detail::IntBitSet<unsigned_int>,bitset_detail::IntBitSet<unsigned_int>>
            (this_00,(FeeFrac *)CONCAT44(CVar2,in_stack_ffffffffffffffd0),
             (IntBitSet<unsigned_int> *)in_RSI,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return CVar2;
  }
  __stack_chk_fail();
}

Assistant:

ClusterIndex AddTransaction(const FeeFrac& feefrac) noexcept
    {
        Assume(TxCount() < SetType::Size());
        ClusterIndex new_idx = TxCount();
        entries.emplace_back(feefrac, SetType::Singleton(new_idx), SetType::Singleton(new_idx));
        return new_idx;
    }